

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O3

void __thiscall ExecutionEngine::i_dcmpl(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  anon_union_8_10_52016fac_for_data aVar1;
  anon_union_8_10_52016fac_for_data aVar2;
  anon_union_8_10_52016fac_for_data aVar3;
  Value VVar4;
  Value VVar5;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar4 = Frame::popTopOfOperandStack(this_01);
  aVar1 = VVar4.data;
  Frame::popTopOfOperandStack(this_01);
  VVar5 = Frame::popTopOfOperandStack(this_01);
  aVar2 = VVar5.data;
  Frame::popTopOfOperandStack(this_01);
  if (VVar4.type != DOUBLE) {
    __assert_fail("value_2.type == ValueType::DOUBLE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xba4,"void ExecutionEngine::i_dcmpl()");
  }
  if ((VVar5._0_8_ & 0xffffffff00000000) == 0x700000000) {
    if ((NAN(aVar2.doubleValue)) || (NAN(aVar1.doubleValue))) {
      aVar3.longValue = 0xffffffff;
    }
    else {
      aVar3.longValue = 1;
      if (aVar2.doubleValue <= aVar1.doubleValue) {
        aVar3.longValue = 0;
        if (aVar2.doubleValue != aVar1.doubleValue) {
          aVar3.longValue = 0xffffffff;
        }
        if (NAN(aVar2.doubleValue) || NAN(aVar1.doubleValue)) {
          aVar3.longValue = 0xffffffff;
        }
      }
    }
    VVar4.data.longValue = aVar3.longValue;
    VVar4.printType = INT;
    VVar4.type = INT;
    Frame::pushIntoOperandStack(this_01,VVar4);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value_1.type == ValueType::DOUBLE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0xba5,"void ExecutionEngine::i_dcmpl()");
}

Assistant:

void ExecutionEngine::i_dcmpl() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	Value value_2 = topFrame->popTopOfOperandStack();
	topFrame->popTopOfOperandStack();
	Value value_1 = topFrame->popTopOfOperandStack();
	topFrame->popTopOfOperandStack();
	Value resultado;
    resultado.printType = ValueType::INT;
	resultado.type = ValueType::INT;

	assert(value_2.type == ValueType::DOUBLE);
	assert(value_1.type == ValueType::DOUBLE);

	if (isnan(value_1.data.doubleValue) || isnan(value_2.data.doubleValue)) {
		resultado.data.intValue = -1;
	} else if (value_1.data.doubleValue > value_2.data.doubleValue) {
		resultado.data.intValue = 1;
	} else if (value_1.data.doubleValue == value_2.data.doubleValue) {
		resultado.data.intValue = 0;
	} else {
		resultado.data.intValue = -1;
	}

	topFrame->pushIntoOperandStack(resultado);

	topFrame->pc += 1;
}